

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall Js::ScriptContext::MarkForClose(ScriptContext *this)

{
  bool bVar1;
  uint uVar2;
  ThreadContext *this_00;
  ScriptContext *this_local;
  
  uVar2 = (*(this->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
  if ((uVar2 & 1) == 0) {
    SaveStartupProfileAndRelease(this,true);
    SetIsClosed(this);
    if ((this->isRootTrackerScriptContext & 1U) != 0) {
      this_00 = GetThreadContext(this);
      ThreadContext::ClearRootTrackerScriptContext(this_00,this);
    }
    bVar1 = ThreadContext::IsInScript(this->threadContext);
    if (bVar1) {
      ThreadContext::AddToPendingScriptContextCloseList(this->threadContext,this);
    }
    else {
      Close(this,false);
    }
  }
  return;
}

Assistant:

void ScriptContext::MarkForClose()
    {
        if (IsClosed())
        {
            return;
        }

        SaveStartupProfileAndRelease(true);
        SetIsClosed();

#ifdef LEAK_REPORT
        if (this->isRootTrackerScriptContext)
        {
            this->GetThreadContext()->ClearRootTrackerScriptContext(this);
        }
#endif

        if (!threadContext->IsInScript())
        {
            Close(FALSE);
        }
        else
        {
            threadContext->AddToPendingScriptContextCloseList(this);
        }
    }